

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O1

Plane<3> *
r3d::tet_face_from_verts(Plane<3> *__return_storage_ptr__,Vector<3> *a,Vector<3> *b,Vector<3> *c)

{
  double dVar1;
  Int i;
  long lVar2;
  Vector<3> normal;
  Vector<3> c_5;
  Vector<3> c_4;
  Vector<3> center;
  Vector<3> c_1;
  Vector<3> c_2;
  double local_1e8;
  UninitT UStack_1e0;
  UninitT local_1d8;
  double local_1c8 [4];
  double local_1a8 [4];
  double local_188 [4];
  double local_168 [4];
  double local_148 [6];
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  UninitT local_e8 [4];
  UninitT local_c8 [4];
  UninitT local_a8 [4];
  UninitT local_88 [4];
  UninitT local_68 [4];
  UninitT local_48 [4];
  UninitT local_28 [4];
  
  local_28[2] = (a->super_Few<double,_3>).array_[2];
  local_28[0] = (a->super_Few<double,_3>).array_[0];
  local_28[1] = (a->super_Few<double,_3>).array_[1];
  local_48[0] = (b->super_Few<double,_3>).array_[0];
  local_48[1] = (b->super_Few<double,_3>).array_[1];
  local_48[2] = (b->super_Few<double,_3>).array_[2];
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_168[2] = 0.0;
  lVar2 = 0;
  do {
    local_168[lVar2] = (double)local_28[lVar2] + (double)local_48[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_68[2] = (c->super_Few<double,_3>).array_[2];
  local_68[0] = (c->super_Few<double,_3>).array_[0];
  local_68[1] = (c->super_Few<double,_3>).array_[1];
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  lVar2 = 0;
  do {
    local_148[lVar2] = local_168[lVar2] + (double)local_68[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_188[2] = 0.0;
  lVar2 = 0;
  do {
    local_188[lVar2] = local_148[lVar2] * 0.3333333333333333;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_88[2] = (b->super_Few<double,_3>).array_[2];
  local_88[0] = (b->super_Few<double,_3>).array_[0];
  local_88[1] = (b->super_Few<double,_3>).array_[1];
  local_a8[0] = (a->super_Few<double,_3>).array_[0];
  local_a8[1] = (a->super_Few<double,_3>).array_[1];
  local_a8[2] = (a->super_Few<double,_3>).array_[2];
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_1a8[2] = 0.0;
  lVar2 = 0;
  do {
    local_1a8[lVar2] = (double)local_88[lVar2] - (double)local_a8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_c8[2] = (c->super_Few<double,_3>).array_[2];
  local_c8[0] = (c->super_Few<double,_3>).array_[0];
  local_c8[1] = (c->super_Few<double,_3>).array_[1];
  local_e8[0] = (a->super_Few<double,_3>).array_[0];
  local_e8[1] = (a->super_Few<double,_3>).array_[1];
  local_e8[2] = (a->super_Few<double,_3>).array_[2];
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  lVar2 = 0;
  do {
    local_1c8[lVar2] = (double)local_c8[lVar2] - local_148[lVar2 + 0xc];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_118 = local_1a8[1] * local_1c8[2] - local_1c8[1] * local_1a8[2];
  local_148[4] = local_1a8[2] * local_1c8[0] - local_1c8[2] * local_1a8[0];
  local_148[5] = local_1a8[0] * local_1c8[1] - local_1c8[0] * local_1a8[1];
  local_148[3] = local_118;
  local_f8 = local_148[4];
  local_f0 = local_148[5];
  local_110 = local_148[4];
  local_108 = local_148[5];
  dVar1 = local_118 * local_118;
  lVar2 = 1;
  do {
    dVar1 = dVar1 + local_148[lVar2 + 9] * local_148[lVar2 + 6];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (dVar1 < 0.0) {
    local_100 = local_118;
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  local_1e8 = 0.0;
  UStack_1e0 = (UninitT)0x0;
  local_1d8 = (UninitT)0x0;
  lVar2 = 0;
  do {
    (&local_1e8)[lVar2] = local_148[lVar2 + 3] / dVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_188[0] = local_1e8 * local_188[0];
  lVar2 = 1;
  do {
    local_188[0] = local_188[0] + (&local_1e8)[lVar2] * local_188[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (__return_storage_ptr__->n).super_Few<double,_3>.array_[2] = local_1d8;
  *(double *)(__return_storage_ptr__->n).super_Few<double,_3>.array_[0].__data = local_1e8;
  (__return_storage_ptr__->n).super_Few<double,_3>.array_[1] = UStack_1e0;
  __return_storage_ptr__->d = -local_188[0];
  return __return_storage_ptr__;
}

Assistant:

R3D_INLINE Plane<3> tet_face_from_verts(Vector<3> a, Vector<3> b, Vector<3> c) {
  auto center = ONE_THIRD * (a + b + c);
  auto normal = normalize(cross((b - a), (c - a)));
  auto d = -(normal * center);
  return Plane<3>{normal, d};
}